

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O1

nh_log_status nh_get_savegame_status(int fd,nh_game_info *gi)

{
  xchar xVar1;
  boolean bVar2;
  schar sVar3;
  int iVar4;
  int32_t iVar5;
  ssize_t sVar6;
  __off_t _Var7;
  long lVar8;
  nh_log_status nVar9;
  nh_log_status nVar10;
  bool bVar11;
  int n;
  char status [8];
  uint savepos;
  uint playmode;
  uint seed;
  int v3;
  int v2;
  int v1;
  char algn [16];
  char gend [16];
  char race [16];
  char role [16];
  unsigned_long_long starttime;
  char encplname [64];
  char header [128];
  flag sg_flags;
  you sg_you;
  memfile mf;
  
  xVar1 = dungeon_topology.d_wiz1_level.dlevel;
  lseek(fd,0,0);
  sVar6 = read(fd,header,0x7f);
  if (0 < sVar6) {
    header[0x7f] = '\0';
    iVar4 = __isoc99_sscanf(header,"NHGAME %4s %x %*8s %d.%d.%d\n%n",status,&savepos,&v1,&v2,&v3,&n)
    ;
    if (4 < iVar4) {
      mf.buf = (char *)((ulong)mf.buf._4_4_ << 0x20);
      iVar4 = __isoc99_sscanf(header + n,"%llx%n",&starttime,&mf);
      if ((int)mf.buf != 0 && 0 < iVar4) {
        lVar8 = (long)n;
        n = (int)(lVar8 + (int)mf.buf);
        iVar4 = __isoc99_sscanf(header + lVar8 + (int)mf.buf,"%x %x %64s %16s %16s %16s %16s",&seed,
                                &playmode,encplname,role,race,gend,algn);
        if (6 < iVar4) {
          _Var7 = lseek(fd,0,2);
          if (status[4] == '\0' && status._0_4_ == 0x656e6f64) {
            nVar9 = LS_DONE;
            bVar11 = false;
          }
          else {
            nVar9 = LS_SAVED;
            if (status[4] == '\0' && status._0_4_ == 0x72706e69) {
              bVar11 = false;
              nVar9 = LS_CRASHED;
            }
            else {
              if (status[4] != '\0' || status._0_4_ != 0x65766173) {
                return LS_INVALID;
              }
              bVar11 = true;
            }
          }
          nVar10 = (uint)(savepos < (uint)_Var7) * 2 + LS_CRASHED;
          if (!bVar11) {
            nVar10 = nVar9;
          }
          bVar2 = lock_fd(fd,0);
          if (bVar2 == '\0') {
            nVar10 = LS_IN_PROGRESS;
          }
          unlock_fd(fd);
          if (gi == (nh_game_info *)0x0) {
            return nVar10;
          }
          memset(gi,0,0x1c0);
          gi->playmode = playmode;
          base64_decode(encplname,gi->name);
          role[0] = lowc(role[0]);
          strcpy(gi->plrole,role);
          strcpy(gi->plrace,race);
          strcpy(gi->plgend,gend);
          strcpy(gi->plalign,algn);
          if (nVar10 == LS_CRASHED) {
            return LS_CRASHED;
          }
          if (nVar10 == LS_IN_PROGRESS) {
            return LS_IN_PROGRESS;
          }
          iVar4 = exit_jmp_buf_valid + 1;
          bVar11 = exit_jmp_buf_valid == 0;
          exit_jmp_buf_valid = iVar4;
          if ((bVar11) && (iVar4 = __sigsetjmp(exit_jmp_buf,1), iVar4 != 0)) {
            return LS_CRASHED;
          }
          lseek(fd,(ulong)savepos,0);
          if (nVar10 == LS_DONE) {
            read_log_toptenentry(fd,(nh_topten_entry *)&mf);
            gi->moves = mf.curcmd;
            gi->depth = mf.len;
            strncpy(gi->death,(char *)((long)mf.tags + 0x5c),0x100);
          }
          else if (nVar10 == LS_SAVED) {
            mf.pos = 0;
            mf.buf = loadfile(fd,&mf.len);
            if (mf.buf == (char *)0x0) {
              return LS_SAVED;
            }
            bVar2 = uptodate(&mf,(char *)0x0);
            if (bVar2 == '\0') {
              free(mf.buf);
              nVar10 = LS_CRASHED;
            }
            else {
              restore_flags(&mf,&sg_flags);
              restore_you(&mf,&sg_you);
              iVar5 = mread32(&mf);
              free(mf.buf);
              if (xVar1 == '\0') {
                dlb_init();
                init_dungeons();
              }
              sVar3 = depth(&sg_you.uz);
              gi->depth = (int)sVar3;
              gi->moves = iVar5;
              gi->level_desc[0] = '\0';
              gi->has_amulet = sg_you.uhave._0_1_ & 1;
              sVar3 = depth(&sg_you.uz);
              topten_level_name((int)sg_you.uz.dnum,(int)sVar3,gi->level_desc);
              if (xVar1 == '\0') {
                free_dungeon();
                dlb_cleanup();
              }
            }
          }
          exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
          return nVar10;
        }
      }
    }
  }
  return LS_INVALID;
}

Assistant:

enum nh_log_status nh_get_savegame_status(int fd, struct nh_game_info *gi)
{
    char header[128], status[8], encplname[PL_NSIZ * 2];
    char role[PLRBUFSZ], race[PLRBUFSZ], gend[PLRBUFSZ], algn[PLRBUFSZ];
    int n, n2, v1, v2, v3;
    unsigned int savepos, endpos, seed, playmode;
    struct memfile mf;
    enum nh_log_status ret;
    boolean game_inited = (wiz1_level.dlevel != 0);
    struct you sg_you;
    struct flag sg_flags;
    long sg_moves;
    unsigned long long starttime;

    lseek(fd, 0, SEEK_SET);
    if (read(fd, header, 127) <= 0) return LS_INVALID;
    header[127] = '\0';

    if (sscanf(header, "NHGAME %4s %x %*8s %d.%d.%d\n%n",
	       status, &savepos, &v1, &v2, &v3, &n) < 5)
	return LS_INVALID;
    n2 = sscan_llx(header + n, &starttime);
    if (!n2) return LS_INVALID;
    n += n2;
    if (sscanf(header + n, "%x %x %64s %16s %16s %16s %16s",
	       &seed, &playmode, encplname, role, race, gend, algn) < 7)
	return LS_INVALID;

    endpos = lseek(fd, 0, SEEK_END);
    if (!strcmp(status, "done"))
	ret = LS_DONE;
    else if (!strcmp(status, "inpr"))
	ret = LS_CRASHED;
    else if (!strcmp(status, "save"))
	ret = LS_SAVED;
    else
	return LS_INVALID;

    if (ret == LS_SAVED && endpos <= savepos)
	ret = LS_CRASHED;

    /* if we can't lock the file, it's in use */
    if (!lock_fd(fd, 0))
	ret = LS_IN_PROGRESS;
    unlock_fd(fd); /* don't need the lock, we're not going to write */

    if (!gi)
	return ret;
    
    memset(gi, 0, sizeof(struct nh_game_info));
    gi->playmode = playmode;
    base64_decode(encplname, gi->name);
    role[0] = lowc(role[0]);
    strcpy(gi->plrole, role);
    strcpy(gi->plrace, race);
    strcpy(gi->plgend, gend);
    strcpy(gi->plalign, algn);
    
    if (ret == LS_CRASHED || ret == LS_IN_PROGRESS)
	return ret;
    
    if (!api_entry_checkpoint())
	/* something went wrong, hopefully it isn't so bad that replay won't work */
	return LS_CRASHED;

    lseek(fd, savepos, SEEK_SET);
    if (ret == LS_SAVED) {
	mf.pos = 0;
	mf.buf = loadfile(fd, &mf.len);
	if (!mf.buf)
	    return 0;
	
	if (!uptodate(&mf, NULL)) {
	    free(mf.buf);
	    api_exit();
	    return LS_CRASHED; /* probably still a valid game */
	}
	
	restore_flags(&mf, &sg_flags);
	restore_you(&mf, &sg_you);
	sg_moves = mread32(&mf);
	free(mf.buf);
	
	/* make sure topten_level_name can work correctly */
	if (!game_inited) {
	    dlb_init();
	    init_dungeons();
	}
	
	gi->depth = depth(&sg_you.uz);
	gi->moves = sg_moves;
	gi->level_desc[0] = '\0';
	gi->has_amulet = sg_you.uhave.amulet;
	topten_level_name(sg_you.uz.dnum, depth(&sg_you.uz), gi->level_desc);
	
	if (!game_inited) {
	    free_dungeon();
	    dlb_cleanup();
	}
    } else if (ret == LS_DONE) {
	struct nh_topten_entry tt;
	
	read_log_toptenentry(fd, &tt);
	gi->moves = tt.moves;
	gi->depth = tt.maxlvl;
	strncpy(gi->death, tt.death, BUFSZ);
    }
    
    api_exit();
    
    return ret;
}